

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

long duckdb::Cast::Operation<duckdb::hugeint_t,_long>(hugeint_t input)

{
  hugeint_t input_00;
  bool bVar1;
  InvalidInputException *this;
  long result;
  undefined1 in_stack_00000190 [16];
  string *in_stack_ffffffffffffff88;
  bool in_stack_ffffffffffffff9f;
  int64_t *in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  long local_18;
  
  input_00.upper = in_stack_ffffffffffffffb0;
  input_00.lower = in_stack_ffffffffffffffa8;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,_long>
                    (input_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::hugeint_t,_long>((hugeint_t)in_stack_00000190);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffff88);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_18;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}